

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O0

void testReadUnpack(string *tempdir)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer pfVar5;
  pointer puVar6;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> zptr;
  unique_ptr<float[],_std::default_delete<float[]>_> gptr;
  exr_result_t _test_rv_2;
  exr_decode_pipeline_t decoder;
  exr_result_t _test_rv_1;
  exr_chunk_info_t cinfo;
  exr_result_t _test_rv;
  exr_context_initializer_t cinit;
  string fn;
  exr_context_t f;
  char *in_stack_fffffffffffffb88;
  float *__p;
  ostream *in_stack_fffffffffffffb90;
  char *in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  allocator<char> *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  undefined1 local_300 [8];
  long local_2f8;
  int local_104;
  float local_100 [17];
  int local_bc;
  undefined8 local_b8;
  code *pcStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  allocator<char> local_31;
  string local_30 [32];
  undefined8 local_10 [2];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  std::allocator<char>::~allocator(&local_31);
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_58 = 0;
  local_b8 = 0x68;
  uStack_60 = 0xbf800000fffffffe;
  pcStack_b0 = err_cb;
  std::__cxx11::string::operator+=(local_30,"v1.7.test.tiled.exr");
  uVar2 = std::__cxx11::string::c_str();
  local_bc = exr_start_read(local_10,uVar2,&local_b8);
  if (local_bc != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_bc);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_bc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                   (uint)((ulong)in_stack_fffffffffffffb90 >> 0x20),in_stack_fffffffffffffb88);
  }
  __p = local_100;
  local_104 = exr_read_tile_chunk_info(local_10[0],0,4,2,0);
  if (local_104 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_104);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(local_104);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                   (uint)((ulong)in_stack_fffffffffffffb90 >> 0x20),(char *)__p);
  }
  iVar1 = exr_decoding_initialize(local_10[0],0,local_100,local_300);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                   (uint)((ulong)in_stack_fffffffffffffb90 >> 0x20),(char *)__p);
  }
  operator_new__(0x480);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)in_stack_fffffffffffffb90,__p);
  operator_new__(0x240);
  std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>::
  unique_ptr<unsigned_short*,std::default_delete<unsigned_short[]>,void,bool>
            ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
             in_stack_fffffffffffffb90,(unsigned_short *)__p);
  pfVar5 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                      in_stack_fffffffffffffb90);
  memset(pfVar5,0,0x480);
  puVar6 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::get
                     ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
                      in_stack_fffffffffffffb90);
  memset(puVar6,0,0x240);
  pfVar5 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                     ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                      in_stack_fffffffffffffb90);
  *(pointer *)(local_2f8 + 0x28) = pfVar5;
  *(undefined4 *)(local_2f8 + 0x20) = 4;
  *(undefined4 *)(local_2f8 + 0x24) = 0x30;
  *(undefined2 *)(local_2f8 + 0x1c) = 4;
  *(undefined2 *)(local_2f8 + 0x1e) = 2;
  puVar6 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::get
                     ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
                      in_stack_fffffffffffffb90);
  *(pointer *)(local_2f8 + 0x58) = puVar6;
  *(undefined4 *)(local_2f8 + 0x50) = 2;
  *(undefined4 *)(local_2f8 + 0x54) = 0x18;
  *(undefined2 *)(local_2f8 + 0x4c) = 2;
  *(undefined2 *)(local_2f8 + 0x4e) = 1;
  iVar1 = exr_decoding_choose_default_routines(local_10[0],0,local_300);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                   (uint)((ulong)in_stack_fffffffffffffb90 >> 0x20),(char *)__p);
  }
  iVar1 = exr_decoding_run(local_10[0],0,local_300);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                   (uint)((ulong)in_stack_fffffffffffffb90 >> 0x20),(char *)__p);
  }
  iVar1 = exr_decoding_destroy(local_10[0],local_300);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    in_stack_fffffffffffffb90 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(in_stack_fffffffffffffb90,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)poVar3,pcVar4,(uint)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                   (char *)__p);
  }
  std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::~unique_ptr
            ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
             in_stack_fffffffffffffb90);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
            ((unique_ptr<float[],_std::default_delete<float[]>_> *)in_stack_fffffffffffffb90);
  exr_finish(local_10);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
testReadUnpack (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "v1.7.test.tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

    exr_chunk_info_t cinfo;
    EXRCORE_TEST_RVAL (exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo));

    {
        exr_decode_pipeline_t decoder;
        EXRCORE_TEST_RVAL (exr_decoding_initialize (f, 0, &cinfo, &decoder));

        std::unique_ptr<float[]>    gptr{new float[24 * 12]};
        std::unique_ptr<uint16_t[]> zptr{new uint16_t[24 * 12]};
        memset (gptr.get (), 0, 24 * 12 * 4);
        memset (zptr.get (), 0, 24 * 12 * 2);
        decoder.channels[0].decode_to_ptr          = (uint8_t*) gptr.get ();
        decoder.channels[0].user_pixel_stride      = 4;
        decoder.channels[0].user_line_stride       = 4 * 12;
        decoder.channels[0].user_bytes_per_element = 4;
        decoder.channels[0].user_data_type         = EXR_PIXEL_FLOAT;
        decoder.channels[1].decode_to_ptr          = (uint8_t*) zptr.get ();
        decoder.channels[1].user_pixel_stride      = 2;
        decoder.channels[1].user_line_stride       = 2 * 12;
        decoder.channels[1].user_bytes_per_element = 2;
        decoder.channels[1].user_data_type         = EXR_PIXEL_HALF;

        EXRCORE_TEST_RVAL (
            exr_decoding_choose_default_routines (f, 0, &decoder));

        EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));

        /* TODO: add actual comparison against C++ library */

        EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));
    }

    exr_finish (&f);
}